

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O1

TestStatus *
vkt::api::anon_unknown_1::
createMultipleUniqueResourcesTest<vkt::api::(anonymous_namespace)::Framebuffer>
          (TestStatus *__return_storage_ptr__,Context *context)

{
  Parameters *extraout_RDX;
  Parameters *extraout_RDX_00;
  Parameters *extraout_RDX_01;
  Parameters *extraout_RDX_02;
  VkImageView attachments [2];
  Environment env;
  VkImageView attachments_1 [2];
  VkImageView attachments_2 [2];
  VkImageView attachments_3 [2];
  Resources res3;
  Resources res2;
  Resources res1;
  Resources res0;
  Move<vk::Handle<(vk::HandleType)23>_> local_568;
  Environment local_540;
  Move<vk::Handle<(vk::HandleType)23>_> local_508;
  Move<vk::Handle<(vk::HandleType)23>_> local_4e8;
  VkFramebufferCreateInfo local_4c8;
  VkFramebuffer local_488;
  Deleter<vk::Handle<(vk::HandleType)23>_> DStack_480;
  Move<vk::Handle<(vk::HandleType)23>_> local_468;
  VkImageView local_448;
  deUint64 local_440;
  Resources local_438;
  Resources local_330;
  Resources local_228;
  Resources local_120;
  
  local_540.vkp = context->m_platformInterface;
  local_540.vkd = Context::getDeviceInterface(context);
  local_540.device = Context::getDevice(context);
  local_540.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  local_540.programBinaries = context->m_progCollection;
  local_540.allocationCallbacks = (VkAllocationCallbacks *)0x0;
  local_540.maxResourceConsumers = 1;
  Framebuffer::Resources::Resources(&local_120,&local_540,extraout_RDX);
  Framebuffer::Resources::Resources(&local_228,&local_540,extraout_RDX_00);
  Framebuffer::Resources::Resources(&local_330,&local_540,extraout_RDX_01);
  Framebuffer::Resources::Resources(&local_438,&local_540,extraout_RDX_02);
  local_568.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal =
       local_120.colorAttachment.object.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object
       .m_internal;
  local_568.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)
       local_120.depthStencilAttachment.object.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data
       .object.m_internal;
  local_4c8.sType = VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO;
  local_4c8.pNext = (void *)0x0;
  local_4c8.flags = 0;
  local_4c8.renderPass.m_internal =
       local_120.renderPass.object.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
       m_internal;
  local_4c8.attachmentCount = 2;
  local_4c8.width = 0x100;
  local_4c8.height = 0x100;
  local_4c8.layers = 1;
  local_4c8.pAttachments = (VkImageView *)&local_568;
  ::vk::createFramebuffer
            (&local_4e8,local_540.vkd,local_540.device,&local_4c8,local_540.allocationCallbacks);
  local_488.m_internal =
       local_4e8.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal;
  DStack_480.m_deviceIface =
       local_4e8.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface;
  DStack_480.m_device =
       local_4e8.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device;
  DStack_480.m_allocator =
       local_4e8.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator;
  local_4c8.pAttachments = (VkImageView *)&local_508;
  local_508.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal =
       local_228.colorAttachment.object.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object
       .m_internal;
  local_508.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)
       local_228.depthStencilAttachment.object.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data
       .object.m_internal;
  local_4c8.sType = VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO;
  local_4c8.pNext = (void *)0x0;
  local_4c8.flags = 0;
  local_4c8.renderPass.m_internal =
       local_228.renderPass.object.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
       m_internal;
  local_4c8.attachmentCount = 2;
  local_4c8.width = 0x100;
  local_4c8.height = 0x100;
  local_4c8.layers = 1;
  ::vk::createFramebuffer
            (&local_568,local_540.vkd,local_540.device,&local_4c8,local_540.allocationCallbacks);
  local_4e8.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal =
       local_568.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal;
  local_4e8.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface =
       local_568.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface;
  local_4e8.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device =
       local_568.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device;
  local_4e8.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator =
       local_568.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator;
  local_4c8.pAttachments = (VkImageView *)&local_468;
  local_468.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal =
       local_330.colorAttachment.object.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object
       .m_internal;
  local_468.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)
       local_330.depthStencilAttachment.object.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data
       .object.m_internal;
  local_4c8.sType = VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO;
  local_4c8.pNext = (void *)0x0;
  local_4c8.flags = 0;
  local_4c8.renderPass.m_internal =
       local_330.renderPass.object.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
       m_internal;
  local_4c8.attachmentCount = 2;
  local_4c8.width = 0x100;
  local_4c8.height = 0x100;
  local_4c8.layers = 1;
  ::vk::createFramebuffer
            (&local_508,local_540.vkd,local_540.device,&local_4c8,local_540.allocationCallbacks);
  local_568.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal =
       local_508.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal;
  local_568.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface =
       local_508.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface;
  local_568.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device =
       local_508.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device;
  local_568.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator =
       local_508.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator;
  local_4c8.pAttachments = &local_448;
  local_448.m_internal =
       local_438.colorAttachment.object.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object
       .m_internal;
  local_440 = local_438.depthStencilAttachment.object.super_RefBase<vk::Handle<(vk::HandleType)13>_>
              .m_data.object.m_internal;
  local_4c8.sType = VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO;
  local_4c8.pNext = (void *)0x0;
  local_4c8.flags = 0;
  local_4c8.renderPass.m_internal =
       local_438.renderPass.object.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
       m_internal;
  local_4c8.attachmentCount = 2;
  local_4c8.width = 0x100;
  local_4c8.height = 0x100;
  local_4c8.layers = 1;
  ::vk::createFramebuffer
            (&local_468,local_540.vkd,local_540.device,&local_4c8,local_540.allocationCallbacks);
  local_508.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal =
       local_468.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal;
  local_508.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface =
       local_468.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface;
  local_508.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device =
       local_468.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device;
  local_508.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator =
       local_468.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator;
  if (local_468.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
              (&local_508.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter,
               (VkFramebuffer)
               local_468.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal);
  }
  if (local_568.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
              (&local_568.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter,
               (VkFramebuffer)
               local_568.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal);
  }
  if (local_4e8.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
              (&local_4e8.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter,
               (VkFramebuffer)
               local_4e8.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal);
  }
  if (local_488.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()(&DStack_480,local_488);
  }
  local_4c8._0_8_ = (void *)((long)&local_4c8 + 0x10U);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c8,"Ok","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_4c8._0_8_,
             (long)local_4c8.pNext + local_4c8._0_8_);
  if ((void *)local_4c8._0_8_ != (void *)((long)&local_4c8 + 0x10U)) {
    operator_delete((void *)local_4c8._0_8_,CONCAT44(local_4c8._20_4_,local_4c8.flags) + 1);
  }
  Framebuffer::Resources::~Resources(&local_438);
  Framebuffer::Resources::~Resources(&local_330);
  Framebuffer::Resources::~Resources(&local_228);
  Framebuffer::Resources::~Resources(&local_120);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMultipleUniqueResourcesTest (Context& context, typename Object::Parameters params)
{
	const Environment					env		(context, 1u);
	const typename Object::Resources	res0	(env, params);
	const typename Object::Resources	res1	(env, params);
	const typename Object::Resources	res2	(env, params);
	const typename Object::Resources	res3	(env, params);

	{
		Unique<typename Object::Type>	obj0	(Object::create(env, res0, params));
		Unique<typename Object::Type>	obj1	(Object::create(env, res1, params));
		Unique<typename Object::Type>	obj2	(Object::create(env, res2, params));
		Unique<typename Object::Type>	obj3	(Object::create(env, res3, params));
	}

	return tcu::TestStatus::pass("Ok");
}